

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

bool cmSystemTools::RepeatedRemoveDirectory(char *dir)

{
  char *pcVar1;
  bool bVar2;
  allocator local_41;
  string local_40;
  int local_1c;
  char *pcStack_18;
  int i;
  char *dir_local;
  
  local_1c = 0;
  pcStack_18 = dir;
  while( true ) {
    pcVar1 = pcStack_18;
    if (9 < local_1c) {
      return false;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_40,pcVar1,&local_41);
    bVar2 = cmsys::SystemTools::RemoveADirectory(&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    if (bVar2) break;
    cmsys::SystemTools::Delay(100);
    local_1c = local_1c + 1;
  }
  return true;
}

Assistant:

bool cmSystemTools::RepeatedRemoveDirectory(const char* dir)
{
  // Windows sometimes locks files temporarily so try a few times.
  for(int i = 0; i < 10; ++i)
    {
    if(cmSystemTools::RemoveADirectory(dir))
      {
      return true;
      }
    cmSystemTools::Delay(100);
    }
  return false;
}